

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall libtorrent::torrent::clear_error(torrent *this)

{
  bool bVar1;
  EVP_PKEY_CTX *in_RSI;
  
  if ((this->m_error).failed_ == true) {
    bVar1 = should_check_files(this);
    (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x2b])
              ();
    (this->m_error).val_ = 0;
    (this->m_error).failed_ = false;
    (this->m_error).cat_ =
         &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
    (this->m_error_file).m_val = -1;
    update_gauge(this);
    state_updated(this);
    update_want_peers(this);
    update_state_list(this);
    if (((this->m_url)._M_string_length != 0) &&
       ((((this->super_torrent_hot_members).m_torrent_file.
          super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_files)
        .m_piece_length < 1)) {
      start_download_url(this);
      return;
    }
    if (((this->field_0x5de & 0x10) == 0) &&
       (0 < (((this->super_torrent_hot_members).m_torrent_file.
              super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            m_files).m_piece_length)) {
      init(this,in_RSI);
    }
    if (!bVar1) {
      bVar1 = should_check_files(this);
      if (bVar1) {
        start_checking(this);
        return;
      }
    }
  }
  return;
}

Assistant:

void torrent::clear_error()
	{
		TORRENT_ASSERT(is_single_thread());
		if (!m_error) return;
		bool const checking_files = should_check_files();
		m_ses.trigger_auto_manage();
		m_error.clear();
		m_error_file = torrent_status::error_file_none;

		update_gauge();
		state_updated();
		update_want_peers();
		update_state_list();

#if TORRENT_ABI_VERSION == 1
		// deprecated in 1.2
		// if we haven't downloaded the metadata from m_url, try again
		if (!m_url.empty() && !m_torrent_file->is_valid())
		{
			start_download_url();
			return;
		}
#endif
		// if the error happened during initialization, try again now
		if (!m_torrent_initialized && valid_metadata()) init();
		if (!checking_files && should_check_files())
			start_checking();
	}